

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_type_create_struct_
               (MPIABI_Fint *count,MPIABI_Fint *array_of_blocklengths,
               MPIABI_Fint *array_of_displacements,MPIABI_Fint *array_of_types,MPIABI_Fint *newtype,
               MPIABI_Fint *ierror)

{
  mpi_type_create_struct_();
  return;
}

Assistant:

void mpiabi_type_create_struct_(
  const MPIABI_Fint * count,
  const MPIABI_Fint * array_of_blocklengths,
  const MPIABI_Fint * array_of_displacements,
  const MPIABI_Fint * array_of_types,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_create_struct_(
    count,
    array_of_blocklengths,
    array_of_displacements,
    array_of_types,
    newtype,
    ierror
  );
}